

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O1

void Pdr_SetPrintStr(Vec_Str_t *vStr,Pdr_Set_t *p,int nRegs,Vec_Int_t *vFlopCounts)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  void *__s;
  char *pcVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  ulong __n;
  uint uVar9;
  
  __s = malloc((long)(nRegs + 1));
  if (nRegs < 1) {
    __n = 0;
  }
  else {
    __n = (ulong)(uint)nRegs;
    memset(__s,0x2d,__n);
  }
  *(undefined1 *)((long)__s + __n) = 0;
  iVar4 = p->nLits;
  if (0 < (long)iVar4) {
    lVar6 = 0;
    do {
      uVar1 = *(uint *)(&p->field_0x14 + lVar6 * 4);
      if (uVar1 != 0xffffffff) {
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        *(byte *)((long)__s + (ulong)(uVar1 >> 1)) = (byte)uVar1 & 1 ^ 0x31;
      }
      lVar6 = lVar6 + 1;
    } while (iVar4 != lVar6);
  }
  if (vFlopCounts == (Vec_Int_t *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar2 = vFlopCounts->nSize;
    if ((long)iVar2 < 1) {
      iVar4 = 0;
    }
    else {
      piVar3 = vFlopCounts->pArray;
      lVar6 = 0;
      iVar4 = 0;
      do {
        if (piVar3[lVar6] != 0) {
          lVar7 = (long)iVar4;
          iVar4 = iVar4 + 1;
          *(undefined1 *)((long)__s + lVar7) = *(undefined1 *)((long)__s + lVar6);
        }
        lVar6 = lVar6 + 1;
      } while (iVar2 != lVar6);
    }
    *(undefined1 *)((long)__s + (long)iVar4) = 0;
  }
  lVar6 = (long)vStr->nSize + (long)iVar4;
  if (vStr->nCap < (int)lVar6) {
    sVar8 = lVar6 * 2;
    if (vStr->nCap < (int)sVar8) {
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar8);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,sVar8);
      }
      vStr->pArray = pcVar5;
      vStr->nCap = (int)sVar8;
    }
  }
  memcpy(vStr->pArray + vStr->nSize,__s,(long)iVar4);
  uVar9 = iVar4 + vStr->nSize;
  vStr->nSize = uVar9;
  uVar1 = vStr->nCap;
  if (uVar9 == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar1 * 2;
      if ((int)sVar8 <= (int)uVar1) goto LAB_005f4b9b;
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar8);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,sVar8);
      }
    }
    vStr->pArray = pcVar5;
    vStr->nCap = (int)sVar8;
  }
LAB_005f4b9b:
  iVar4 = vStr->nSize;
  vStr->nSize = iVar4 + 1;
  vStr->pArray[iVar4] = ' ';
  uVar1 = vStr->nCap;
  if (vStr->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar1 * 2;
      if ((int)sVar8 <= (int)uVar1) goto LAB_005f4c0a;
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar8);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,sVar8);
      }
    }
    vStr->pArray = pcVar5;
    vStr->nCap = (int)sVar8;
  }
LAB_005f4c0a:
  iVar4 = vStr->nSize;
  vStr->nSize = iVar4 + 1;
  vStr->pArray[iVar4] = '1';
  uVar1 = vStr->nCap;
  if (vStr->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar1 * 2;
      if ((int)sVar8 <= (int)uVar1) goto LAB_005f4c75;
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar8);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,sVar8);
      }
    }
    vStr->pArray = pcVar5;
    vStr->nCap = (int)sVar8;
  }
LAB_005f4c75:
  iVar4 = vStr->nSize;
  vStr->nSize = iVar4 + 1;
  vStr->pArray[iVar4] = '\n';
  if (__s == (void *)0x0) {
    return;
  }
  free(__s);
  return;
}

Assistant:

void Pdr_SetPrintStr( Vec_Str_t * vStr, Pdr_Set_t * p, int nRegs, Vec_Int_t * vFlopCounts )
{
    char * pBuff;
    int i, k = 0, Entry;
    pBuff = ABC_ALLOC( char, nRegs + 1 );
    for ( i = 0; i < nRegs; i++ )
        pBuff[i] = '-';
    pBuff[i] = 0;
    for ( i = 0; i < p->nLits; i++ )
    {
        if ( p->Lits[i] == -1 )
            continue;
        pBuff[Abc_Lit2Var(p->Lits[i])] = (Abc_LitIsCompl(p->Lits[i])? '0':'1');
    }
    if ( vFlopCounts )
    {
        // skip some literals
        Vec_IntForEachEntry( vFlopCounts, Entry, i )
            if ( Entry ) 
                pBuff[k++] = pBuff[i];
        pBuff[k] = 0;
    }
    Vec_StrPushBuffer( vStr, pBuff, k );
    Vec_StrPush( vStr, ' ' );
    Vec_StrPush( vStr, '1' );
    Vec_StrPush( vStr, '\n' );
    ABC_FREE( pBuff );
}